

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

optional<std::shared_ptr<IdentifierExpressionAstNode>_> * __thiscall
Parser::parseIdentiferExpression
          (optional<std::shared_ptr<IdentifierExpressionAstNode>_> *__return_storage_ptr__,
          Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<Token> token;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48 [3];
  allocator<char> local_2a;
  undefined1 local_29;
  bool error;
  
  local_29 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             "Expected an identifer",&local_2a);
  expect((Parser *)&stack0xffffffffffffffa0,(TokenType)this,(bool *)0x18,(string *)&local_29);
  std::__cxx11::string::~string
            ((string *)&token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<IdentifierExpressionAstNode,std::shared_ptr<Token>&>
            ((shared_ptr<Token> *)
             &token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  _Var1._M_pi = local_48[0]._M_pi;
  (__return_storage_ptr__->
  super__Optional_base<std::shared_ptr<IdentifierExpressionAstNode>,_false,_false>)._M_payload.
  super__Optional_payload<std::shared_ptr<IdentifierExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<IdentifierExpressionAstNode>_>._M_payload._M_value.
  super___shared_ptr<IdentifierExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  local_48[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->
  super__Optional_base<std::shared_ptr<IdentifierExpressionAstNode>,_false,_false>)._M_payload.
  super__Optional_payload<std::shared_ptr<IdentifierExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<IdentifierExpressionAstNode>_>._M_payload._M_value.
  super___shared_ptr<IdentifierExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->
  super__Optional_base<std::shared_ptr<IdentifierExpressionAstNode>,_false,_false>)._M_payload.
  super__Optional_payload<std::shared_ptr<IdentifierExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<IdentifierExpressionAstNode>_>._M_engaged = true;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&token);
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<IdentifierExpressionAstNode>>
Parser::parseIdentiferExpression() noexcept {
  bool error = false;
  auto token = this->expect(TokenType::Identifier, error, "Expected an identifer");
  return std::make_shared<IdentifierExpressionAstNode>(token);
}